

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O2

void __thiscall DynamicGraph::printInfo(DynamicGraph *this)

{
  set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  *this_00;
  pointer pRVar1;
  ostream *poVar2;
  size_type sVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  _Base_ptr p_Var5;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  ulong uVar6;
  Edge e;
  key_type local_78;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_58;
  ulong local_38;
  
  this_00 = &this->virtualEdges;
  uVar6 = 0;
  while (uVar6 < (ulong)((long)(this->level).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->level).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Vertex ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout," - component ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout," - level ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout," - pred: ");
    pRVar1 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = uVar6;
    for (p_Var5 = *(_Base_ptr *)((long)&pRVar1[uVar6].a_pred._M_t._M_impl + 0x18);
        p_Var5 != (_Rb_tree_node_base *)((long)&pRVar1[uVar6].a_pred._M_t._M_impl + 8U);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_58,(boost *)p_Var5[1]._M_parent,*(vertex_descriptor *)(p_Var5 + 1),
                 (vertex_descriptor)this,in_R8);
      local_78.m_eproperty = local_58.first.m_eproperty;
      local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           local_58.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           local_58.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      sVar3 = std::
              set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::count(this_00,&local_78);
      if (sVar3 != 0) {
        std::operator<<((ostream *)&std::cout,"~");
      }
      pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_78)
      ;
      std::operator<<(pbVar4," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout," - sibl: ");
    pRVar1 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (p_Var5 = *(_Base_ptr *)((long)&pRVar1[uVar6].b_sibl._M_t._M_impl + 0x18);
        p_Var5 != (_Rb_tree_node_base *)((long)&pRVar1[uVar6].b_sibl._M_t._M_impl + 8U);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_58,(boost *)p_Var5[1]._M_parent,*(vertex_descriptor *)(p_Var5 + 1),
                 (vertex_descriptor)this,in_R8);
      local_78.m_eproperty = local_58.first.m_eproperty;
      local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           local_58.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           local_58.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      sVar3 = std::
              set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::count(this_00,&local_78);
      if (sVar3 != 0) {
        std::operator<<((ostream *)&std::cout,"~");
      }
      pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_78)
      ;
      std::operator<<(pbVar4," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout," - succ: ");
    pRVar1 = (this->relatives).super__Vector_base<Relatives,_std::allocator<Relatives>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (p_Var5 = *(_Base_ptr *)((long)&pRVar1[uVar6].c_succ._M_t._M_impl + 0x18);
        p_Var5 != (_Rb_tree_node_base *)((long)&pRVar1[uVar6].c_succ._M_t._M_impl + 8U);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      boost::
      edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                (&local_58,(boost *)p_Var5[1]._M_parent,*(vertex_descriptor *)(p_Var5 + 1),
                 (vertex_descriptor)this,in_R8);
      local_78.m_eproperty = local_58.first.m_eproperty;
      local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           local_58.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      local_78.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
           local_58.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      sVar3 = std::
              set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ::count(this_00,&local_78);
      if (sVar3 != 0) {
        std::operator<<((ostream *)&std::cout,"~");
      }
      pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_78)
      ;
      std::operator<<(pbVar4," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar6 = local_38 + 1;
  }
  return;
}

Assistant:

void DynamicGraph::printInfo() const
{
    for (Vertex v = 0; v < this->level.size(); v++) {
        std::cout << "Vertex " << v  << std::endl;
        std::cout << " - component " << this->components[v] << std::endl;
        std::cout << " - level " << this->level[v] << std::endl;
        std::cout << " - pred: ";
        for (const auto &ei : this->relatives[v].a_pred) {
            Vertex u = source(ei, *this);
            Vertex w = target(ei, *this);
            Edge e = edge(w, u, *this).first;
            if(this->virtualEdges.count(e)) {
                std::cout << "~";
            }
            std::cout << e << " ";
        }
        std::cout << std::endl;
        std::cout << " - sibl: ";
        for (const auto &ei : this->relatives[v].b_sibl) {
            Vertex u = source(ei, *this);
            Vertex w = target(ei, *this);
            Edge e = edge(w, u, *this).first;
            if(this->virtualEdges.count(e)) {
                std::cout << "~";
            }
            std::cout << e << " ";
        }
        std::cout << std::endl;
        std::cout << " - succ: ";
        for (const auto &ei : this->relatives[v].c_succ) {
            Vertex u = source(ei, *this);
            Vertex w = target(ei, *this);
            Edge e = edge(w, u, *this).first;
            if(this->virtualEdges.count(e)) {
                std::cout << "~";
            }
            std::cout << e << " ";
        }
        std::cout << std::endl;
    }
}